

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testError.cpp
# Opt level: O1

void testRoundingError(void)

{
  anon_unknown.dwarf_112d7f::testNormalizedRounding(10);
  anon_unknown.dwarf_112d7f::testDenormalizedRounding(10);
  anon_unknown.dwarf_112d7f::testNormalizedRounding(9);
  anon_unknown.dwarf_112d7f::testDenormalizedRounding(9);
  anon_unknown.dwarf_112d7f::testNormalizedRounding(1);
  anon_unknown.dwarf_112d7f::testDenormalizedRounding(1);
  anon_unknown.dwarf_112d7f::testNormalizedRounding(0);
  anon_unknown.dwarf_112d7f::testDenormalizedRounding(0);
  return;
}

Assistant:

void
testRoundingError ()
{
    testNormalizedRounding (10);
    testDenormalizedRounding (10);
    testNormalizedRounding (9);
    testDenormalizedRounding (9);
    testNormalizedRounding (1);
    testDenormalizedRounding (1);
    testNormalizedRounding (0);
    testDenormalizedRounding (0);
}